

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O1

int avl_insert(avl_tree *tree,avl_node *new)

{
  list_entity *plVar1;
  avl_node *paVar2;
  int iVar3;
  avl_node *node;
  avl_node *paVar4;
  int diff;
  int local_24;
  
  new->balance = '\0';
  new->follower = false;
  new->parent = (avl_node *)0x0;
  new->left = (avl_node *)0x0;
  new->right = (avl_node *)0x0;
  if (tree->root == (avl_node *)0x0) {
    plVar1 = (tree->list_head).next;
    (new->list).next = plVar1;
    (new->list).prev = &tree->list_head;
    plVar1->prev = &new->list;
    (tree->list_head).next = &new->list;
    tree->root = new;
    tree->count = 1;
  }
  else {
    node = _avl_find_rec(tree->root,new->key,tree->comp,&local_24);
    iVar3 = (*tree->comp)(new->key,node->key);
    if (iVar3 == 0) {
      if (tree->allow_dups != true) {
        return -1;
      }
      new->follower = true;
      plVar1 = (node->list).next;
      (new->list).next = plVar1;
      (new->list).prev = &node->list;
      plVar1->prev = &new->list;
      (node->list).next = &new->list;
      tree->count = tree->count + 1;
    }
    else {
      new->parent = node;
      if (node->balance == -1) {
        paVar2 = node;
        do {
          paVar4 = paVar2;
          if ((avl_node *)(tree->list_head).prev == paVar4) break;
          paVar2 = (avl_node *)(paVar4->list).next;
        } while (paVar2->follower != false);
        plVar1 = (paVar4->list).next;
        (new->list).next = plVar1;
        (new->list).prev = &paVar4->list;
        plVar1->prev = &new->list;
        (paVar4->list).next = &new->list;
        tree->count = tree->count + 1;
        node->balance = '\0';
        node->right = new;
      }
      else if (node->balance == '\x01') {
        plVar1 = (node->list).prev;
        (new->list).next = &node->list;
        (new->list).prev = plVar1;
        (node->list).prev = &new->list;
        plVar1->next = &new->list;
        tree->count = tree->count + 1;
        node->balance = '\0';
        node->left = new;
      }
      else {
        if (iVar3 < 0) {
          plVar1 = (node->list).prev;
          (new->list).next = &node->list;
          (new->list).prev = plVar1;
          (node->list).prev = &new->list;
          plVar1->next = &new->list;
          tree->count = tree->count + 1;
          node->balance = -1;
          node->left = new;
        }
        else {
          paVar2 = node;
          do {
            paVar4 = paVar2;
            if ((avl_node *)(tree->list_head).prev == paVar4) break;
            paVar2 = (avl_node *)(paVar4->list).next;
          } while (paVar2->follower != false);
          plVar1 = (paVar4->list).next;
          (new->list).next = plVar1;
          (new->list).prev = &paVar4->list;
          plVar1->prev = &new->list;
          (paVar4->list).next = &new->list;
          tree->count = tree->count + 1;
          node->balance = '\x01';
          node->right = new;
        }
        _post_insert(tree,node);
      }
    }
  }
  return 0;
}

Assistant:

int
avl_insert(struct avl_tree *tree, struct avl_node *new) {
  struct avl_node *node, *last;
  int diff;

  new->parent = NULL;

  new->left = NULL;
  new->right = NULL;

  new->balance = 0;
  new->follower = false;

  if (tree->root == NULL) {
    list_add_head(&tree->list_head, &new->list);
    tree->root = new;
    tree->count = 1;
    return 0;
  }

  node = _avl_find_rec(tree->root, new->key, tree->comp, &diff);

  diff = (*tree->comp)(new->key, node->key);

  if (diff == 0) {
    if (!tree->allow_dups)
      return -1;

    new->follower = true;

    /* add new node outside the tree, because key is already present */
    _avl_insert_after(tree, node, new);
    return 0;
  }

  new->parent = node;

  if (node->balance == 1) {
    _avl_insert_before(tree, node, new);
    node->balance = 0;
    node->left = new;
    return 0;
  }

  if (node->balance == -1) {
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 0;
    node->right = new;
    return 0;
  }

  if (diff < 0) {
    _avl_insert_before(tree, node, new);

    node->balance = -1;
    node->left = new;
    _post_insert(tree, node);
  }
  else { /* diff > 0 */
    last = _avl_find_last(tree, node);
    _avl_insert_after(tree, last, new);

    node->balance = 1;
    node->right = new;
    _post_insert(tree, node);
  }
  return 0;
}